

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O3

IterateResult __thiscall deqp::gls::RandomShaderCase::iterate(RandomShaderCase *this)

{
  Type TVar1;
  TextureFormat log;
  RenderContext *pRVar2;
  ShaderInput *pSVar3;
  MessageBuilder *message;
  pointer pSVar4;
  Variable *pVVar5;
  Texture2D *pTVar6;
  TextureCube *pTVar7;
  pointer indices;
  bool bVar8;
  int iVar9;
  int iVar10;
  deUint32 dVar11;
  GLenum GVar12;
  GLuint index;
  GLint location;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  size_t sVar13;
  _Base_ptr p_Var14;
  TestError *this_00;
  Scalar *pSVar15;
  uint *puVar16;
  uint x;
  uint y;
  char *pcVar17;
  ChannelOrder CVar18;
  long lVar19;
  pointer pVVar20;
  _Rb_tree_header *p_Var21;
  pair<int,_const_glu::Texture2D_*> *ppVar22;
  pair<int,_const_glu::TextureCube_*> *ppVar23;
  pointer pVVar24;
  _Self __tmp;
  ConstValueAccess value;
  ConstValueAccess value_00;
  ConstValueAccess value_01;
  vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
  texCubeBindings;
  vector<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
  tex2DBindings;
  TextureLevel rendered;
  Random rnd;
  TextureLevel reference;
  ProgramSources sources;
  ProgramExecutor executor;
  ShaderProgram program;
  pair<int,_const_glu::TextureCube_*> *local_418;
  iterator iStack_410;
  pair<int,_const_glu::TextureCube_*> *local_408;
  pair<int,_const_glu::Texture2D_*> *local_3f8;
  iterator iStack_3f0;
  pair<int,_const_glu::Texture2D_*> *local_3e8;
  int local_3d8;
  int local_3d4;
  undefined1 local_3d0 [40];
  Shader *local_3a8;
  Shader *local_3a0;
  ConstPixelBufferAccess local_398;
  deRandom local_370;
  TextureLevel local_360;
  undefined1 local_338 [8];
  TextureCube *pTStack_330;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_320 [4];
  ios_base local_2c0 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_2a8;
  undefined1 local_288 [208];
  undefined1 local_1b8 [144];
  ConstPixelBufferAccess local_128;
  ShaderProgram local_100;
  
  log = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  pRVar2 = this->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,(this->m_vertexShader).m_source._M_dataplus._M_p,
             (allocator<char> *)&local_360);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3d0,(this->m_fragmentShader).m_source._M_dataplus._M_p,
             (allocator<char> *)&local_398);
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_338,0,0xac);
  local_288._0_8_ = (pointer)0x0;
  local_288[8] = 0;
  local_288._9_7_ = 0;
  local_288[0x10] = 0;
  local_288._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_338,(value_type *)local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_320,(value_type *)local_3d0);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar2,(ProgramSources *)local_338);
  local_3a0 = &this->m_fragmentShader;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_288);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_2a8);
  lVar19 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_338 + lVar19));
    lVar19 = lVar19 + -0x18;
  } while (lVar19 != -0x18);
  if (local_3d0._0_8_ != (long)local_3d0 + 0x10) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  if (local_1b8._0_8_ != (long)local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  glu::operator<<((TestLog *)log,&local_100);
  if (local_100.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Failed to compile shader");
  }
  else {
    deRandom_init(&local_370,(this->m_parameters).seed);
    iVar9 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar9 = *(int *)CONCAT44(extraout_var,iVar9);
    if (0x3f < iVar9) {
      iVar9 = 0x40;
    }
    iVar10 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar10 = *(int *)(CONCAT44(extraout_var_00,iVar10) + 4);
    local_3d8 = 0x40;
    if (iVar10 < 0x40) {
      local_3d8 = iVar10;
    }
    iVar10 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar10 = *(int *)CONCAT44(extraout_var_01,iVar10);
    dVar11 = deRandom_getUint32(&local_370);
    x = dVar11 % ((iVar10 - iVar9) + 1U);
    iVar10 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar10 = *(int *)(CONCAT44(extraout_var_02,iVar10) + 4);
    dVar11 = deRandom_getUint32(&local_370);
    y = dVar11 % ((iVar10 - local_3d8) + 1U);
    iVar10 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    CVar18 = (0 < *(int *)(CONCAT44(extraout_var_03,iVar10) + 0x14)) + RGB;
    local_338._4_4_ = UNORM_INT8;
    local_338._0_4_ = CVar18;
    tcu::TextureLevel::TextureLevel
              ((TextureLevel *)local_3d0,(TextureFormat *)local_338,iVar9,local_3d8,1);
    local_338._4_4_ = UNORM_INT8;
    tcu::TextureLevel::TextureLevel(&local_360,(TextureFormat *)local_338,iVar9,local_3d8,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_338,&local_360);
    rsg::ProgramExecutor::ProgramExecutor
              ((ProgramExecutor *)local_1b8,(PixelBufferAccess *)local_338,this->m_gridWidth,
               this->m_gridHeight);
    local_3a8 = &this->m_vertexShader;
    glwUseProgram(local_100.m_program.m_program);
    GVar12 = glwGetError();
    pSVar15 = (Scalar *)0x1e6;
    glu::checkError(GVar12,"glUseProgram(program.getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x1e6);
    pVVar20 = (this->m_vertexArrays).
              super__Vector_base<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_3d4 = iVar9;
    if (pVVar20 !=
        (this->m_vertexArrays).
        super__Vector_base<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        index = glwGetAttribLocation
                          (local_100.m_program.m_program,
                           (pVVar20->m_input->m_variable->m_name)._M_dataplus._M_p);
        local_338 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_330);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_330,"attribute[",10);
        std::ostream::operator<<((ostringstream *)&pTStack_330,index);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_330,"]: ",3);
        pcVar17 = (pVVar20->m_input->m_variable->m_name)._M_dataplus._M_p;
        if (pcVar17 == (char *)0x0) {
          std::ios::clear((int)(ostringstream *)&pTStack_330 +
                          (int)pTStack_330[-1].m_refTexture.m_view.m_levels[4]);
        }
        else {
          sVar13 = strlen(pcVar17);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_330,pcVar17,sVar13)
          ;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_330," = ",3);
        pSVar3 = pVVar20->m_input;
        message = (MessageBuilder *)pSVar3->m_variable;
        pSVar4 = (pSVar3->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        value.m_value = pSVar15;
        value.m_type = (VariableType *)
                       (pSVar3->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        anon_unknown_5::operator<<((anon_unknown_5 *)local_338,message,value);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_330," -> ",4);
        value_00.m_value = pSVar15;
        value_00.m_type = (VariableType *)pSVar4;
        anon_unknown_5::operator<<((anon_unknown_5 *)local_338,message,value_00);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pTStack_330);
        std::ios_base::~ios_base(local_2c0);
        if (-1 < (int)index) {
          pSVar15 = (Scalar *)0x0;
          glwVertexAttribPointer
                    (index,(pVVar20->m_input->m_variable->m_type).m_numElements,0x1406,'\0',0,
                     (pVVar20->m_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl
                     .super__Vector_impl_data._M_start);
          glwEnableVertexAttribArray(index);
        }
        pVVar20 = pVVar20 + 1;
      } while (pVVar20 !=
               (this->m_vertexArrays).
               super__Vector_base<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    GVar12 = glwGetError();
    puVar16 = (uint *)0x1f6;
    glu::checkError(GVar12,"After attribute setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x1f6);
    pVVar24 = (this->m_uniforms).
              super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pVVar24 !=
        (this->m_uniforms).
        super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        location = glwGetUniformLocation
                             (local_100.m_program.m_program,
                              (pVVar24->m_variable->m_name)._M_dataplus._M_p);
        local_338 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTStack_330);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_330,"uniform[",8);
        std::ostream::operator<<((ostringstream *)&pTStack_330,location);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_330,"]: ",3);
        pcVar17 = (pVVar24->m_variable->m_name)._M_dataplus._M_p;
        if (pcVar17 == (char *)0x0) {
          std::ios::clear((int)pTStack_330[-1].m_refTexture.m_view.m_levels[4] +
                          (int)(ostringstream *)&pTStack_330);
        }
        else {
          sVar13 = strlen(pcVar17);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_330,pcVar17,sVar13)
          ;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pTStack_330," = ",3);
        value_01.m_value = (Scalar *)puVar16;
        value_01.m_type =
             (VariableType *)
             (pVVar24->m_storage).m_value.
             super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
             super__Vector_impl_data._M_start;
        anon_unknown_5::operator<<
                  ((anon_unknown_5 *)local_338,(MessageBuilder *)pVVar24->m_variable,value_01);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pTStack_330);
        std::ios_base::~ios_base(local_2c0);
        if (-1 < location) {
          pVVar5 = pVVar24->m_variable;
          TVar1 = (pVVar5->m_type).m_baseType;
          if (TYPE_SAMPLER_CUBE < TVar1) {
LAB_0181b25e:
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Unsupported type",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                       ,0x194);
LAB_0181b2b6:
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          pSVar4 = (pVVar24->m_storage).m_value.
                   super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((0xccU >> (TVar1 & 0x1f) & 1) == 0) {
            if (TVar1 != TYPE_FLOAT) goto LAB_0181b25e;
            puVar16 = &switchD_0181acc1::switchdataD_01cb5010;
            switch((pVVar5->m_type).m_numElements) {
            case 1:
              glwUniform1fv(location,1,&pSVar4->floatVal);
              break;
            case 2:
              glwUniform2fv(location,1,&pSVar4->floatVal);
              break;
            case 3:
              glwUniform3fv(location,1,&pSVar4->floatVal);
              break;
            case 4:
              glwUniform4fv(location,1,&pSVar4->floatVal);
              break;
            default:
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Unsupported type",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                         ,0x181);
              goto LAB_0181b2b6;
            }
          }
          else {
            puVar16 = &switchD_0181ac88::switchdataD_01cb5000;
            switch((pVVar5->m_type).m_numElements) {
            case 1:
              glwUniform1iv(location,1,&pSVar4->intVal);
              break;
            case 2:
              glwUniform2iv(location,1,&pSVar4->intVal);
              break;
            case 3:
              glwUniform3iv(location,1,&pSVar4->intVal);
              break;
            case 4:
              glwUniform4iv(location,1,&pSVar4->intVal);
              break;
            default:
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Unsupported type",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                         ,399);
              goto LAB_0181b2b6;
            }
          }
        }
        pVVar24 = pVVar24 + 1;
      } while (pVVar24 !=
               (this->m_uniforms).
               super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    GVar12 = glwGetError();
    glu::checkError(GVar12,"After uniform setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x202);
    local_3f8 = (pair<int,_const_glu::Texture2D_*> *)0x0;
    iStack_3f0._M_current = (pair<int,_const_glu::Texture2D_*> *)0x0;
    local_3e8 = (pair<int,_const_glu::Texture2D_*> *)0x0;
    p_Var14 = (this->m_texManager).m_tex2D._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var21 = &(this->m_texManager).m_tex2D._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var14 != p_Var21) {
      do {
        local_338._0_4_ = p_Var14[1]._M_color;
        pTStack_330 = (TextureCube *)p_Var14[1]._M_parent;
        if (iStack_3f0._M_current == local_3e8) {
          std::
          vector<std::pair<int,glu::Texture2D_const*>,std::allocator<std::pair<int,glu::Texture2D_const*>>>
          ::_M_realloc_insert<std::pair<int,glu::Texture2D_const*>>
                    ((vector<std::pair<int,glu::Texture2D_const*>,std::allocator<std::pair<int,glu::Texture2D_const*>>>
                      *)&local_3f8,iStack_3f0,(pair<int,_const_glu::Texture2D_*> *)local_338);
        }
        else {
          *(undefined1 (*) [8])iStack_3f0._M_current = local_338;
          (iStack_3f0._M_current)->second = (Texture2D *)pTStack_330;
          iStack_3f0._M_current = iStack_3f0._M_current + 1;
        }
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
      } while ((_Rb_tree_header *)p_Var14 != p_Var21);
    }
    local_418 = (pair<int,_const_glu::TextureCube_*> *)0x0;
    iStack_410._M_current = (pair<int,_const_glu::TextureCube_*> *)0x0;
    local_408 = (pair<int,_const_glu::TextureCube_*> *)0x0;
    p_Var14 = (this->m_texManager).m_texCube._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var21 = &(this->m_texManager).m_texCube._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var14 != p_Var21) {
      do {
        local_338._0_4_ = p_Var14[1]._M_color;
        pTStack_330 = (TextureCube *)p_Var14[1]._M_parent;
        if (iStack_410._M_current == local_408) {
          std::
          vector<std::pair<int,glu::TextureCube_const*>,std::allocator<std::pair<int,glu::TextureCube_const*>>>
          ::_M_realloc_insert<std::pair<int,glu::TextureCube_const*>>
                    ((vector<std::pair<int,glu::TextureCube_const*>,std::allocator<std::pair<int,glu::TextureCube_const*>>>
                      *)&local_418,iStack_410,(pair<int,_const_glu::TextureCube_*> *)local_338);
        }
        else {
          *(undefined1 (*) [8])iStack_410._M_current = local_338;
          (iStack_410._M_current)->second = pTStack_330;
          iStack_410._M_current = iStack_410._M_current + 1;
        }
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
      } while ((_Rb_tree_header *)p_Var14 != p_Var21);
    }
    if (local_3f8 != iStack_3f0._M_current) {
      ppVar22 = local_3f8;
      do {
        iVar9 = ppVar22->first;
        pTVar6 = ppVar22->second;
        glwActiveTexture(iVar9 + 0x84c0);
        glwBindTexture(0xde1,pTVar6->m_glTexture);
        glu::mapGLSampler((Sampler *)local_338,0x812f,0x812f,0x2601,0x2601);
        rsg::ProgramExecutor::setTexture
                  ((ProgramExecutor *)local_1b8,iVar9,&pTVar6->m_refTexture,(Sampler *)local_338);
        ppVar22 = ppVar22 + 1;
      } while (ppVar22 != iStack_3f0._M_current);
    }
    GVar12 = glwGetError();
    glu::checkError(GVar12,"After 2D texture setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x212);
    if (local_418 != iStack_410._M_current) {
      ppVar23 = local_418;
      do {
        iVar9 = ppVar23->first;
        pTVar7 = ppVar23->second;
        glwActiveTexture(iVar9 + 0x84c0);
        glwBindTexture(0x8513,pTVar7->m_glTexture);
        glu::mapGLSampler((Sampler *)local_338,0x812f,0x812f,0x2601,0x2601);
        rsg::ProgramExecutor::setTexture
                  ((ProgramExecutor *)local_1b8,iVar9,&pTVar7->m_refTexture,(Sampler *)local_338);
        ppVar23 = ppVar23 + 1;
      } while (ppVar23 != iStack_410._M_current);
    }
    GVar12 = glwGetError();
    glu::checkError(GVar12,"After cubemap setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x21e);
    glwViewport(x,y,local_3d4,local_3d8);
    indices = (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
    glwDrawElements(4,(GLsizei)((ulong)((long)(this->m_indices).
                                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)indices) >> 1),0x1403,indices);
    glwFlush();
    GVar12 = glwGetError();
    glu::checkError(GVar12,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x224);
    rsg::ProgramExecutor::execute
              ((ProgramExecutor *)local_1b8,local_3a8,local_3a0,&this->m_uniforms);
    if ((TextureFormat)local_3d0._0_8_ == (TextureFormat)0x300000008) {
      pRVar2 = this->m_renderCtx;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_338,(TextureLevel *)local_3d0);
      glu::readPixels(pRVar2,x,y,(PixelBufferAccess *)local_338);
    }
    else {
      local_398.m_format.order = RGBA;
      local_398.m_format.type = UNORM_INT8;
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)local_338,&local_398.m_format,local_3d0._8_4_,local_3d0._12_4_,1);
      pRVar2 = this->m_renderCtx;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_398,(TextureLevel *)local_338);
      glu::readPixels(pRVar2,x,y,(PixelBufferAccess *)&local_398);
      GVar12 = glwGetError();
      glu::checkError(GVar12,"Read pixels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                      ,0x22e);
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_398,(TextureLevel *)local_3d0);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_128,(TextureLevel *)local_338);
      tcu::copy((EVP_PKEY_CTX *)&local_398,(EVP_PKEY_CTX *)&local_128);
      tcu::TextureLevel::~TextureLevel((TextureLevel *)local_338);
    }
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_338,&local_360);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_398,(TextureLevel *)local_3d0);
    bVar8 = tcu::fuzzyCompare((TestLog *)log,"Result","Result images",
                              (ConstPixelBufferAccess *)local_338,&local_398,0.02,COMPARE_LOG_RESULT
                             );
    pcVar17 = "Image comparison failed";
    if (bVar8) {
      pcVar17 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,(uint)!bVar8,pcVar17);
    if (local_418 != (pair<int,_const_glu::TextureCube_*> *)0x0) {
      operator_delete(local_418,(long)local_408 - (long)local_418);
    }
    if (local_3f8 != (pair<int,_const_glu::Texture2D_*> *)0x0) {
      operator_delete(local_3f8,(long)local_3e8 - (long)local_3f8);
    }
    rsg::ProgramExecutor::~ProgramExecutor((ProgramExecutor *)local_1b8);
    tcu::TextureLevel::~TextureLevel(&local_360);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_3d0);
  }
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return STOP;
}

Assistant:

RandomShaderCase::IterateResult RandomShaderCase::iterate (void)
{
	tcu::TestLog& log = m_testCtx.getLog();

	// Compile program
	glu::ShaderProgram program(m_renderCtx, glu::makeVtxFragSources(m_vertexShader.getSource(), m_fragmentShader.getSource()));
	log << program;

	if (!program.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
		return STOP;
	}

	// Compute random viewport
	de::Random				rnd				(m_parameters.seed);
	int						viewportWidth	= de::min<int>(VIEWPORT_WIDTH,	m_renderCtx.getRenderTarget().getWidth());
	int						viewportHeight	= de::min<int>(VIEWPORT_HEIGHT,	m_renderCtx.getRenderTarget().getHeight());
	int						viewportX		= rnd.getInt(0, m_renderCtx.getRenderTarget().getWidth()	- viewportWidth);
	int						viewportY		= rnd.getInt(0, m_renderCtx.getRenderTarget().getHeight()	- viewportHeight);
	bool					hasAlpha		= m_renderCtx.getRenderTarget().getPixelFormat().alphaBits > 0;
	tcu::TextureLevel		rendered		(tcu::TextureFormat(hasAlpha ? tcu::TextureFormat::RGBA : tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8), viewportWidth, viewportHeight);
	tcu::TextureLevel		reference		(tcu::TextureFormat(hasAlpha ? tcu::TextureFormat::RGBA : tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8), viewportWidth, viewportHeight);

	// Reference program executor.
	rsg::ProgramExecutor	executor		(reference.getAccess(), m_gridWidth, m_gridHeight);

	GLU_CHECK_CALL(glUseProgram(program.getProgram()));

	// Set up attributes
	for (vector<VertexArray>::const_iterator attribIter = m_vertexArrays.begin(); attribIter != m_vertexArrays.end(); attribIter++)
	{
		GLint location = glGetAttribLocation(program.getProgram(), attribIter->getName());

		// Print to log.
		log << tcu::TestLog::Message << "attribute[" << location << "]: " << attribIter->getName() << " = " << attribIter->getValueRange() << tcu::TestLog::EndMessage;

		if (location >= 0)
		{
			glVertexAttribPointer(location, attribIter->getNumComponents(), GL_FLOAT, GL_FALSE, 0, &attribIter->getVertices()[0]);
			glEnableVertexAttribArray(location);
		}
	}
	GLU_CHECK_MSG("After attribute setup");

	// Uniforms
	for (vector<rsg::VariableValue>::const_iterator uniformIter = m_uniforms.begin(); uniformIter != m_uniforms.end(); uniformIter++)
	{
		GLint location = glGetUniformLocation(program.getProgram(), uniformIter->getVariable()->getName());

		log << tcu::TestLog::Message << "uniform[" << location << "]: " << uniformIter->getVariable()->getName() << " = " << uniformIter->getValue() << tcu::TestLog::EndMessage;

		if (location >= 0)
			setUniformValue(location, uniformIter->getValue());
	}
	GLU_CHECK_MSG("After uniform setup");

	// Textures
	vector<pair<int, const glu::Texture2D*> >	tex2DBindings		= m_texManager.getBindings2D();
	vector<pair<int, const glu::TextureCube*> >	texCubeBindings		= m_texManager.getBindingsCube();

	for (vector<pair<int, const glu::Texture2D*> >::const_iterator i = tex2DBindings.begin(); i != tex2DBindings.end(); i++)
	{
		int						unitNdx		= i->first;
		const glu::Texture2D*	texture		= i->second;

		glActiveTexture(GL_TEXTURE0 + unitNdx);
		glBindTexture(GL_TEXTURE_2D, texture->getGLTexture());

		executor.setTexture(unitNdx, &texture->getRefTexture(), glu::mapGLSampler(TEXTURE_WRAP_S, TEXTURE_WRAP_T, TEXTURE_MIN_FILTER, TEXTURE_MAG_FILTER));
	}
	GLU_CHECK_MSG("After 2D texture setup");

	for (vector<pair<int, const glu::TextureCube*> >::const_iterator i = texCubeBindings.begin(); i != texCubeBindings.end(); i++)
	{
		int						unitNdx		= i->first;
		const glu::TextureCube*	texture		= i->second;

		glActiveTexture(GL_TEXTURE0 + unitNdx);
		glBindTexture(GL_TEXTURE_CUBE_MAP, texture->getGLTexture());

		executor.setTexture(unitNdx, &texture->getRefTexture(), glu::mapGLSampler(TEXTURE_WRAP_S, TEXTURE_WRAP_T, TEXTURE_MIN_FILTER, TEXTURE_MAG_FILTER));
	}
	GLU_CHECK_MSG("After cubemap setup");

	// Draw and read
	glViewport(viewportX, viewportY, viewportWidth, viewportHeight);
	glDrawElements(GL_TRIANGLES, (GLsizei)m_indices.size(), GL_UNSIGNED_SHORT, &m_indices[0]);
	glFlush();
	GLU_CHECK_MSG("Draw");

	// Render reference while GPU is doing work
	executor.execute(m_vertexShader, m_fragmentShader, m_uniforms);

	if (rendered.getFormat().order != tcu::TextureFormat::RGBA || rendered.getFormat().type != tcu::TextureFormat::UNORM_INT8)
	{
		// Read as GL_RGBA8
		tcu::TextureLevel readBuf(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), rendered.getWidth(), rendered.getHeight());
		glu::readPixels(m_renderCtx, viewportX, viewportY, readBuf.getAccess());
		GLU_CHECK_MSG("Read pixels");
		tcu::copy(rendered, readBuf);
	}
	else
		glu::readPixels(m_renderCtx, viewportX, viewportY, rendered.getAccess());

	// Compare
	{
		float	threshold	= 0.02f;
		bool	imagesOk	= tcu::fuzzyCompare(log, "Result", "Result images", reference.getAccess(), rendered.getAccess(), threshold, tcu::COMPARE_LOG_RESULT);

		if (imagesOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}

	return STOP;
}